

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O1

void __thiscall
World_3df::mutate(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  size_type *psVar1;
  element_type *peVar2;
  long lVar3;
  int iVar4;
  creat_t *pcVar5;
  undefined4 extraout_var;
  char *__function;
  shared_ptr<Population> *psVar6;
  element_type *peVar7;
  longlong lVar8;
  size_t val;
  Msg local_2a8;
  Msg local_278;
  Msg local_248;
  Msg local_218;
  Msg local_1e8;
  Msg local_1b8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  element_type *local_108;
  shared_count local_100;
  double local_f8;
  longlong local_f0;
  double local_e8;
  Msg local_e0;
  Msg local_b0;
  Msg local_80;
  longlong local_50;
  shared_ptr<Population> *local_48;
  long local_40;
  World_3df *local_38;
  
  peVar2 = (this->super_World).LOGFILE.px;
  local_1e8.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_1e8._vptr_Msg = (_func_int **)peVar2;
  local_48 = dst;
  local_38 = this;
  if (peVar2 == (element_type *)0x0) {
LAB_00112dc9:
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                  "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
                 );
  }
  util::logging::Msg::Msg(&local_1b8,"Mutowanie z p_m = ",L_NORM);
  util::logging::Msg::operator+(&local_e0,&local_1b8,0.005);
  psVar1 = &local_80.msg_txt._M_string_length;
  local_80._vptr_Msg = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"...","");
  util::logging::Msg::operator+(&local_b0,&local_e0,(string *)&local_80);
  (*(peVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar2,&local_b0);
  util::logging::Msg::~Msg(&local_b0);
  psVar6 = local_48;
  if (local_80._vptr_Msg != (_func_int **)psVar1) {
    operator_delete(local_80._vptr_Msg);
  }
  util::logging::Msg::~Msg(&local_e0);
  util::logging::Msg::~Msg(&local_1b8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e8.msg_txt);
  if ((psVar6->px != (element_type *)0x0) && (peVar7 = psVar6->px, peVar7 != (element_type *)0x0)) {
    val = psVar6->px->ELITE_SIZE;
    local_40 = val << 4;
    lVar8 = 0;
    do {
      pcVar5 = Population::get_creatures(peVar7);
      if ((ulong)((long)(pcVar5->
                        super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pcVar5->
                        super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) <= val) {
        peVar2 = (local_38->super_World).LOGFILE.px;
        local_1e8.msg_txt._M_dataplus._M_p = (pointer)(local_38->super_World).LOGFILE.pn.pi_;
        if ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
          LOCK();
          ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p)->use_count_ =
               ((sp_counted_base *)local_1e8.msg_txt._M_dataplus._M_p)->use_count_ + 1;
          UNLOCK();
        }
        psVar1 = &local_80.msg_txt._M_string_length;
        local_1e8._vptr_Msg = (_func_int **)peVar2;
        if (peVar2 != (element_type *)0x0) {
          util::logging::Msg::Msg(&local_1b8,"... W sumie ",L_NORM);
          util::logging::Msg::operator+(&local_e0,&local_1b8,lVar8);
          local_80._vptr_Msg = (_func_int **)psVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80," mutacji","");
          util::logging::Msg::operator+(&local_b0,&local_e0,(string *)&local_80);
          (*(peVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar2,&local_b0);
          util::logging::Msg::~Msg(&local_b0);
          if (local_80._vptr_Msg != (_func_int **)psVar1) {
            operator_delete(local_80._vptr_Msg);
          }
          util::logging::Msg::~Msg(&local_e0);
          util::logging::Msg::~Msg(&local_1b8);
          boost::detail::shared_count::~shared_count((shared_count *)&local_1e8.msg_txt);
          peVar2 = (local_38->super_World).LOGFILE.px;
          local_e0.msg_txt._M_dataplus._M_p = (pointer)(local_38->super_World).LOGFILE.pn.pi_;
          if ((sp_counted_base *)local_e0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
            LOCK();
            ((sp_counted_base *)local_e0.msg_txt._M_dataplus._M_p)->use_count_ =
                 ((sp_counted_base *)local_e0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
            UNLOCK();
          }
          local_e0._vptr_Msg = (_func_int **)peVar2;
          if (peVar2 != (element_type *)0x0) {
            util::logging::Msg::Msg(&local_b0,anon_var_dwarf_371b6,L_NORM);
            (*(peVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar2,&local_b0);
            util::logging::Msg::~Msg(&local_b0);
            boost::detail::shared_count::~shared_count((shared_count *)&local_e0.msg_txt);
            return;
          }
        }
        goto LAB_00112dc9;
      }
      local_f0 = lVar8;
      if (psVar6->px == (Population *)0x0) break;
      pcVar5 = Population::get_creatures(psVar6->px);
      lVar3 = *(long *)((long)&((pcVar5->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->px + local_40);
      if (lVar3 == 0) {
LAB_00112daa:
        __function = 
        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
        ;
        goto LAB_00112dbf;
      }
      peVar7 = psVar6->px;
      if (peVar7 == (element_type *)0x0) break;
      local_f8 = *(double *)(lVar3 + 0x30);
      iVar4 = (*peVar7->_vptr_Population[4])(0x3f747ae147ae147b,peVar7,val);
      local_50 = CONCAT44(extraout_var,iVar4);
      if (psVar6->px == (Population *)0x0) break;
      pcVar5 = Population::get_creatures(psVar6->px);
      lVar3 = *(long *)((long)&((pcVar5->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->px + local_40);
      if (lVar3 == 0) goto LAB_00112daa;
      local_e8 = *(double *)(lVar3 + 0x30);
      peVar2 = (local_38->super_World).LOGFILE.px;
      local_100.pi_ = (local_38->super_World).LOGFILE.pn.pi_;
      if (local_100.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_100.pi_)->use_count_ = (local_100.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_108 = peVar2;
      if (peVar2 == (element_type *)0x0) goto LAB_00112dc9;
      util::logging::Msg::Msg(&local_278,anon_var_dwarf_37254,L_NORM);
      util::logging::Msg::operator+(&local_218,&local_278,val);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,anon_var_dwarf_3726a,anon_var_dwarf_3726a + 0xc);
      util::logging::Msg::operator+(&local_2a8,&local_218,&local_188);
      util::logging::Msg::operator+(&local_248,&local_2a8,local_50);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168," mutacji {","");
      util::logging::Msg::operator+(&local_1e8,&local_248,&local_168);
      util::logging::Msg::operator+(&local_80,&local_1e8,local_f8);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148," -> ","");
      util::logging::Msg::operator+(&local_1b8,&local_80,&local_148);
      util::logging::Msg::operator+(&local_e0,&local_1b8,local_e8);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"}","");
      util::logging::Msg::operator+(&local_b0,&local_e0,&local_128);
      (*(peVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar2,&local_b0);
      util::logging::Msg::~Msg(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_e0);
      util::logging::Msg::~Msg(&local_1b8);
      lVar8 = local_f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_80);
      util::logging::Msg::~Msg(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_248);
      util::logging::Msg::~Msg(&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_218);
      util::logging::Msg::~Msg(&local_278);
      boost::detail::shared_count::~shared_count(&local_100);
      lVar8 = lVar8 + local_50;
      val = val + 1;
      peVar7 = local_48->px;
      local_40 = local_40 + 0x10;
      psVar6 = local_48;
    } while (peVar7 != (element_type *)0x0);
  }
  __function = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
  ;
LAB_00112dbf:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

void World_3df::mutate( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.005;

	(*get_log()) << util::logging::Msg("Mutowanie z p_m = ") + prob + "...";

	size_t mcc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		double m1 = dst->get_creatures()[i]->get_fitness();
		size_t mc = dst->mutate(i, prob);
		double m2 = dst->get_creatures()[i]->get_fitness();

		(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i) + "] zaliczył "
				+ static_cast<long long> (mc) + " mutacji {" + m1 + " -> " + m2 + "}";
		mcc += mc;

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " mutacji";

	(*get_log()) << "Już";
}